

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<QString,_QDBusConnectionPrivate::SignalHook>::detach
          (iterator *__return_storage_ptr__,
          QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *this,const_iterator it)

{
  Span *pSVar1;
  Chain *pCVar2;
  uchar *puVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  if ((uint)(this->d->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
    (__return_storage_ptr__->i).d = it.i.d;
    (__return_storage_ptr__->i).bucket = it.i.bucket;
    __return_storage_ptr__->e = it.e;
    if (it.e == (Chain **)0x0 &&
        it.i.d != (Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_> *)0x0
       ) {
      __return_storage_ptr__->e =
           (Chain **)
           ((it.i.d)->spans[it.i.bucket >> 7].entries
            [(it.i.d)->spans[it.i.bucket >> 7].offsets[(uint)it.i.bucket & 0x7f]].storage.data +
           0x18);
    }
  }
  else {
    uVar4 = it.i.bucket >> 7;
    uVar5 = (uint)it.i.bucket & 0x7f;
    lVar6 = 0;
    for (pCVar2 = *(Chain **)
                   ((it.i.d)->spans[uVar4].entries[(it.i.d)->spans[uVar4].offsets[uVar5]].storage.
                    data + 0x18); pCVar2 != *it.e; pCVar2 = pCVar2->next) {
      lVar6 = lVar6 + 1;
    }
    detach_helper(this);
    pSVar1 = this->d->spans;
    puVar3 = pSVar1[uVar4].entries[pSVar1[uVar4].offsets[uVar5]].storage.data + 0x18;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      puVar3 = (uchar *)(*(long *)puVar3 + 0xb8);
    }
    (__return_storage_ptr__->i).d = this->d;
    (__return_storage_ptr__->i).bucket = it.i.bucket;
    __return_storage_ptr__->e = (Chain **)puVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

iterator detach(const_iterator it)
    {
        auto i = it.i;
        Chain **e = it.e;
        if (d->ref.isShared()) {
            // need to store iterator position before detaching
            qsizetype n = 0;
            Chain *entry = i.node()->value;
            while (entry != *it.e) {
                ++n;
                entry = entry->next;
            }
            Q_ASSERT(entry);
            detach_helper();

            i = d->detachedIterator(i);
            e = &i.node()->value;
            while (n) {
                e = &(*e)->next;
                --n;
            }
            Q_ASSERT(e && *e);
        }
        return iterator(i, e);
    }